

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O2

REF_STATUS ref_validation_cell_node(REF_GRID ref_grid)

{
  REF_NODE pRVar1;
  REF_CELL ref_cell;
  bool bVar2;
  REF_STATUS RVar3;
  ulong uVar4;
  ulong uVar5;
  int cell;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  REF_INT nodes [27];
  
  pRVar1 = ref_grid->node;
  uVar7 = 0;
  do {
    if (uVar7 == 0x10) {
      return 0;
    }
    ref_cell = ref_grid->cell[uVar7];
    for (cell = 0; cell < ref_cell->max; cell = cell + 1) {
      RVar3 = ref_cell_nodes(ref_cell,cell,nodes);
      if (RVar3 == 0) {
        uVar5 = 0;
        uVar4 = (ulong)(uint)ref_cell->node_per;
        if (ref_cell->node_per < 1) {
          uVar4 = uVar5;
        }
        bVar8 = false;
        for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
          lVar6 = (long)nodes[uVar5];
          if (((lVar6 < 0) || (ref_grid->node->max <= nodes[uVar5])) ||
             (ref_grid->node->global[lVar6] < 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                   ,0x18a,"ref_validation_cell_node",1,"cell with invalid node");
            printf("group %d node_per %d\n",uVar7 & 0xffffffff,(ulong)(uint)ref_cell->node_per);
            return 1;
          }
          bVar2 = !bVar8;
          bVar8 = true;
          if (bVar2) {
            bVar8 = ref_grid->mpi->id == pRVar1->part[lVar6];
          }
        }
        if (!bVar8) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,400,"ref_validation_cell_node",1,"cell with all ghost nodes");
          return 1;
        }
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_validation_cell_node(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT group;
  REF_INT cell, node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL has_local;

  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      has_local = REF_FALSE;
      for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
        if (!ref_node_valid(ref_grid_node(ref_grid), nodes[node])) {
          RSB(REF_FAILURE, "cell with invalid node", {
            printf("group %d node_per %d\n", group,
                   ref_cell_node_per(ref_cell));
          });
        }
        has_local = has_local || (ref_mpi_rank(ref_grid_mpi(ref_grid)) ==
                                  ref_node_part(ref_node, nodes[node]));
      }
      if (!has_local) {
        RSS(REF_FAILURE, "cell with all ghost nodes");
      }
    }
  }

  return REF_SUCCESS;
}